

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O3

bool IsTrDosDirSector(Sector *sector)

{
  uint uVar1;
  Data *pDVar2;
  long lVar3;
  pointer puVar4;
  bool bVar5;
  
  pDVar2 = Sector::data_copy(sector,0);
  bVar5 = false;
  if (((sector->header).sector == 1) && (bVar5 = false, (sector->header).size == 1)) {
    uVar1 = Sector::size(sector);
    bVar5 = true;
    if (0xf < uVar1) {
      lVar3 = ((ulong)(long)(int)uVar1 >> 4) + (ulong)((ulong)(long)(int)uVar1 >> 4 == 0);
      puVar4 = (pDVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 0xf;
      do {
        if ((1 < puVar4[-0xf]) &&
           (((0xf < puVar4[-1] || ((char)*puVar4 < '\x01')) || (puVar4[-2] == '\0')))) {
          return false;
        }
        puVar4 = puVar4 + 0x10;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  return bVar5;
}

Assistant:

bool IsTrDosDirSector(const Sector& sector)
{
    auto& data = sector.data_copy();

    // Check sector number and size
    if (sector.header.sector != 1 || sector.header.size != 1)
        return false;

    auto dir_entries = sector.size() / sizeof(TRDOS_DIR);
    auto pd = reinterpret_cast<const TRDOS_DIR*>(data.data());

    for (size_t entry = 0; entry < dir_entries; ++entry, ++pd)
    {
        if (!IsTrDosDirEntry(pd))
            return false;
    }

    return true;
}